

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

TemplateDictionary * __thiscall
ctemplate::TemplateDictionary::AddIncludeDictionary
          (TemplateDictionary *this,TemplateString include_name)

{
  small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *c;
  TemplateString key;
  TemplateDictionary *pTVar1;
  TemplateId v;
  DictVector *value;
  char *in_R9;
  string newname;
  TemplateDictionary *local_68;
  string local_60;
  TemplateString local_40;
  
  LazilyCreateDict<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>>
            (this,&this->include_dict_);
  c = this->include_dict_;
  v = TemplateString::GetGlobalId(&include_name);
  value = find_ptr2<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                    (c,v);
  if (value == (second_type)0x0) {
    value = CreateDictVector(this);
    key.length_ = include_name.length_;
    key.ptr_ = include_name.ptr_;
    key.is_immutable_ = include_name.is_immutable_;
    key._17_7_ = include_name._17_7_;
    key.id_ = include_name.id_;
    HashInsert<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>
              (this->include_dict_,key,value);
    if (value == (DictVector *)0x0) {
      __assert_fail("dicts != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                    ,0x27c,
                    "TemplateDictionary *ctemplate::TemplateDictionary::AddIncludeDictionary(const TemplateString)"
                   );
    }
  }
  CreateSubdictName_abi_cxx11_
            (&local_60,(TemplateDictionary *)&this->name_,&include_name,
             (TemplateString *)
             (((long)(value->
                     super__Vector_base<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(value->
                     super__Vector_base<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) + 1),0x135aa7,in_R9);
  local_40.ptr_ = local_60._M_dataplus._M_p;
  local_40.length_ = local_60._M_string_length;
  local_40.is_immutable_ = false;
  local_40.id_ = 0;
  local_68 = CreateTemplateSubdict
                       (this,&local_40,this->arena_,(TemplateDictionary *)0x0,
                        this->template_global_dict_owner_);
  std::
  vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
  ::push_back(value,&local_68);
  pTVar1 = local_68;
  std::__cxx11::string::~string((string *)&local_60);
  return pTVar1;
}

Assistant:

TemplateDictionary* TemplateDictionary::AddIncludeDictionary(
    const TemplateString include_name) {
  LazilyCreateDict(&include_dict_);
  DictVector* dicts = find_ptr2(*include_dict_, include_name.GetGlobalId());
  if (!dicts) {
    dicts = CreateDictVector();
    HashInsert(include_dict_, include_name, dicts);
  }
  assert(dicts != NULL);
  const string newname(CreateSubdictName(name_, include_name,
                                         dicts->size() + 1, ""));
  TemplateDictionary* retval = CreateTemplateSubdict(
      newname, arena_, NULL, template_global_dict_owner_);
  dicts->push_back(retval);
  return retval;
}